

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

char * arg_strptime(char *buf,char *fmt,tm *tm)

{
  int *piVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  ushort *puVar6;
  __int32_t *p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ushort **ppuVar12;
  size_t n;
  __int32_t **pp_Var13;
  long lVar14;
  int llim;
  tm *ptVar15;
  char *pcVar16;
  tm *dest;
  int *dest_00;
  tm *ptVar17;
  byte bVar18;
  long lVar19;
  byte *pbVar20;
  bool bVar21;
  byte *local_68;
  tm *local_60;
  int local_54;
  int *local_50;
  tm *local_48;
  ushort **local_40;
  tm *local_38;
  
  bVar18 = *fmt;
  if (bVar18 == 0) {
switchD_00104c0d_caseD_26:
    return buf;
  }
  local_68 = (byte *)buf;
  ppuVar12 = __ctype_b_loc();
  piVar1 = &tm->tm_min;
  ptVar17 = (tm *)&tm->tm_hour;
  ptVar15 = (tm *)&tm->tm_mday;
  bVar9 = false;
  dest_00 = &tm->tm_wday;
LAB_00104b9b:
  buf = (char *)0x0;
  puVar6 = *ppuVar12;
  pbVar20 = (byte *)fmt + 2;
  while (pbVar2 = local_68, (*(byte *)((long)puVar6 + (long)(char)bVar18 * 2 + 1) & 0x20) != 0) {
    local_68 = local_68 + -1;
    do {
      pbVar2 = local_68 + 1;
      local_68 = local_68 + 1;
    } while ((*(byte *)((long)puVar6 + (long)(char)*pbVar2 * 2 + 1) & 0x20) != 0);
    bVar18 = ((byte *)fmt)[1];
    fmt = (char *)((byte *)fmt + 1);
    pbVar20 = pbVar20 + 1;
    if (bVar18 == 0) {
      return (char *)local_68;
    }
  }
  local_50 = dest_00;
  if (bVar18 == 0x25) {
    bVar8 = true;
    bVar10 = true;
    bVar21 = true;
LAB_00104bf3:
    bVar18 = pbVar20[-1];
    switch(bVar18) {
    case 0x25:
      goto switchD_00104c0d_caseD_25;
    default:
      goto switchD_00104c0d_caseD_26;
    case 0x41:
    case 0x61:
      if (!bVar8) {
        return (char *)0x0;
      }
      lVar19 = 0;
      lVar14 = 0;
      local_60 = ptVar15;
      local_48 = ptVar17;
      local_40 = ppuVar12;
      local_38 = tm;
      goto LAB_00104db7;
    case 0x42:
    case 0x62:
    case 0x68:
      if (!bVar8) {
        return (char *)0x0;
      }
      lVar19 = 0;
      lVar14 = 0;
      local_60 = ptVar15;
      local_48 = ptVar17;
      local_40 = ppuVar12;
      local_38 = tm;
      goto LAB_00104c88;
    case 0x43:
      if (!bVar10) {
        return (char *)0x0;
      }
      local_48 = ptVar17;
      iVar11 = conv_num((char **)&local_68,&local_54,0,99);
      if (iVar11 == 0) {
        return (char *)0x0;
      }
      if (bVar9) {
        tm->tm_year = local_54 * 100 + tm->tm_year % 100;
      }
      else {
        tm->tm_year = local_54 * 100;
      }
      goto LAB_00105394;
    case 0x44:
      if (!bVar8) {
        return (char *)0x0;
      }
      goto LAB_0010522a;
    case 0x45:
      bVar21 = false;
      if (!bVar8) {
        return (char *)0x0;
      }
      bVar10 = true;
      goto LAB_00104c2d;
    case 0x48:
      if (!bVar21) {
        return (char *)0x0;
      }
      goto LAB_00105241;
    case 0x49:
      if (!bVar21) {
        return (char *)0x0;
      }
      goto LAB_00104fa7;
    case 0x4d:
      if (!bVar21) {
        return (char *)0x0;
      }
      llim = 0;
      iVar11 = 0x3b;
      dest = (tm *)piVar1;
      goto LAB_00105250;
    case 0x4f:
      bVar10 = false;
      if (!bVar8) {
        return (char *)0x0;
      }
      bVar21 = true;
LAB_00104c2d:
      pbVar20 = pbVar20 + 1;
      bVar8 = false;
      goto LAB_00104bf3;
    case 0x52:
      if (!bVar8) {
        return (char *)0x0;
      }
      pcVar16 = "%H:%M";
      break;
    case 0x53:
      if (!bVar21) {
        return (char *)0x0;
      }
      llim = 0;
      iVar11 = 0x3d;
      dest = tm;
      goto LAB_00105250;
    case 0x54:
      if (!bVar8) {
        return (char *)0x0;
      }
      goto LAB_001052a4;
    case 0x55:
    case 0x57:
      if (!bVar21) {
        return (char *)0x0;
      }
      llim = 0;
      iVar11 = 0x35;
      dest = (tm *)&local_54;
      goto LAB_00105250;
    case 0x58:
      if (!bVar10) {
        return (char *)0x0;
      }
LAB_001052a4:
      pcVar16 = "%H:%M:%S";
      break;
    case 0x59:
      if (!bVar10) {
        return (char *)0x0;
      }
      local_48 = ptVar17;
      iVar11 = conv_num((char **)&local_68,&local_54,0,9999);
      if (iVar11 == 0) {
        return (char *)0x0;
      }
      tm->tm_year = local_54 + -0x76c;
      ptVar17 = local_48;
      goto LAB_001053a0;
    case 99:
      if (!bVar10) {
        return (char *)0x0;
      }
      pcVar16 = "%x %X";
      break;
    case 100:
    case 0x65:
      if (!bVar21) {
        return (char *)0x0;
      }
      llim = 1;
      iVar11 = 0x1f;
      dest = ptVar15;
      goto LAB_00105250;
    case 0x6a:
      if (!bVar8) {
        return (char *)0x0;
      }
      local_48 = ptVar17;
      iVar11 = conv_num((char **)&local_68,&local_54,1,0x16e);
      if (iVar11 == 0) {
        return (char *)0x0;
      }
      tm->tm_yday = local_54 + -1;
      ptVar17 = local_48;
      goto LAB_001053a0;
    case 0x6b:
      if (!(bool)(bVar8 & bVar21)) {
        return (char *)0x0;
      }
LAB_00105241:
      llim = 0;
      iVar11 = 0x17;
      dest = ptVar17;
LAB_00105250:
      local_60 = ptVar15;
      iVar11 = conv_num((char **)&local_68,&dest->tm_sec,llim,iVar11);
      bVar21 = iVar11 == 0;
      goto LAB_001052ea;
    case 0x6c:
      if (!(bool)(bVar8 & bVar21)) {
        return (char *)0x0;
      }
LAB_00104fa7:
      local_60 = ptVar15;
      iVar11 = conv_num((char **)&local_68,&ptVar17->tm_sec,1,0xc);
      if (iVar11 == 0) {
        return (char *)0x0;
      }
      ptVar15 = local_60;
      if (ptVar17->tm_sec == 0xc) {
        ptVar17->tm_sec = 0;
      }
      goto LAB_001053a0;
    case 0x6d:
      if (!bVar21) {
        return (char *)0x0;
      }
      local_48 = ptVar17;
      iVar11 = conv_num((char **)&local_68,&local_54,1,0xc);
      if (iVar11 == 0) {
        return (char *)0x0;
      }
      tm->tm_mon = local_54 + -1;
      ptVar17 = local_48;
      goto LAB_001053a0;
    case 0x6e:
    case 0x74:
      if (!bVar8) {
        return (char *)0x0;
      }
      local_68 = local_68 + -1;
      do {
        pbVar2 = local_68 + 1;
        local_68 = local_68 + 1;
      } while ((*(byte *)((long)puVar6 + (long)(char)*pbVar2 * 2 + 1) & 0x20) != 0);
      goto LAB_001053a0;
    case 0x70:
      if (!bVar8) {
        return (char *)0x0;
      }
      local_48 = ptVar17;
      pp_Var13 = __ctype_tolower_loc();
      p_Var7 = *pp_Var13;
      lVar14 = 0;
      goto LAB_0010512b;
    case 0x72:
      if (!bVar8) {
        return (char *)0x0;
      }
      pcVar16 = "%I:%M:%S %p";
      break;
    case 0x77:
      if (!bVar21) {
        return (char *)0x0;
      }
      local_60 = ptVar15;
      iVar11 = conv_num((char **)&local_68,dest_00,0,6);
      ptVar15 = local_60;
      local_50 = dest_00;
      if (iVar11 == 0) {
        return (char *)0x0;
      }
      goto LAB_001053a0;
    case 0x78:
      if (!bVar10) {
        return (char *)0x0;
      }
LAB_0010522a:
      pcVar16 = "%m/%d/%y";
      break;
    case 0x79:
      local_48 = ptVar17;
      iVar11 = conv_num((char **)&local_68,&local_54,0,99);
      if (iVar11 == 0) {
        return (char *)0x0;
      }
      if (bVar9) {
        tm->tm_year = (tm->tm_year / 100) * 100 + local_54;
LAB_00105394:
        bVar9 = true;
        ptVar17 = local_48;
      }
      else {
        iVar11 = local_54;
        if (local_54 < 0x45) {
          iVar11 = local_54 + 100;
        }
        tm->tm_year = iVar11;
        bVar9 = true;
        ptVar17 = local_48;
      }
      goto LAB_001053a0;
    }
    local_60 = ptVar15;
    local_68 = (byte *)arg_strptime((char *)local_68,pcVar16,tm);
    bVar21 = local_68 == (byte *)0x0;
LAB_001052ea:
    ptVar15 = local_60;
    if (bVar21) {
      return (char *)0x0;
    }
    goto LAB_001053a0;
  }
  pbVar20 = (byte *)fmt + 1;
  goto LAB_00104c3a;
  while (lVar14 = lVar14 + 1, lVar14 != 3) {
LAB_0010512b:
    pbVar3 = (byte *)("AM" + lVar14);
    pbVar4 = pbVar2 + lVar14;
    ptVar17 = local_48;
    if (p_Var7[*pbVar3] != p_Var7[*pbVar4]) goto LAB_001052fa;
  }
  if (p_Var7[*pbVar3] == p_Var7[*pbVar4]) {
    if (0xb < tm->tm_hour) {
      return (char *)0x0;
    }
    local_68 = pbVar2 + 2;
  }
  else {
LAB_001052fa:
    lVar14 = 0;
    do {
      pbVar3 = (byte *)("PM" + lVar14);
      pbVar4 = pbVar2 + lVar14;
      if (p_Var7[*pbVar3] != p_Var7[*pbVar4]) {
        return (char *)0x0;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    if (p_Var7[*pbVar3] != p_Var7[*pbVar4]) {
      return (char *)0x0;
    }
    if (0xb < tm->tm_hour) {
      return (char *)0x0;
    }
    tm->tm_hour = tm->tm_hour + 0xc;
    local_68 = pbVar2 + 2;
  }
  goto LAB_001053a0;
  while( true ) {
    pcVar16 = *(char **)((long)abmon + lVar19);
    n = strlen(pcVar16);
    iVar11 = arg_strncasecmp(pcVar16,(char *)pbVar2,n);
    if (iVar11 == 0) goto LAB_00104cea;
    lVar14 = lVar14 + 1;
    lVar19 = lVar19 + 8;
    if (lVar14 == 0xc) break;
LAB_00104c88:
    pcVar16 = *(char **)((long)mon + lVar19);
    n = strlen(pcVar16);
    iVar11 = arg_strncasecmp(pcVar16,(char *)pbVar2,n);
    if (iVar11 == 0) goto LAB_00104cea;
  }
  lVar14 = 0xc;
LAB_00104cea:
  local_54 = (int)lVar14;
  if (local_54 == 0xc) {
    return (char *)0x0;
  }
  local_38->tm_mon = local_54;
  goto LAB_00104e45;
  while( true ) {
    pcVar16 = *(char **)((long)abday + lVar19);
    n = strlen(pcVar16);
    iVar11 = arg_strncasecmp(pcVar16,(char *)pbVar2,n);
    if (iVar11 == 0) goto LAB_00104e19;
    lVar14 = lVar14 + 1;
    lVar19 = lVar19 + 8;
    if (lVar14 == 7) break;
LAB_00104db7:
    pcVar16 = *(char **)((long)day + lVar19);
    n = strlen(pcVar16);
    iVar11 = arg_strncasecmp(pcVar16,(char *)pbVar2,n);
    if (iVar11 == 0) goto LAB_00104e19;
  }
  lVar14 = 7;
LAB_00104e19:
  local_54 = (int)lVar14;
  if (local_54 == 7) {
    return (char *)0x0;
  }
  local_38->tm_wday = local_54;
LAB_00104e45:
  local_68 = local_68 + n;
  ptVar15 = local_60;
  ptVar17 = local_48;
  ppuVar12 = local_40;
  tm = local_38;
LAB_001053a0:
  bVar18 = *pbVar20;
  dest_00 = local_50;
  fmt = (char *)pbVar20;
  if (bVar18 == 0) {
    return (char *)local_68;
  }
  goto LAB_00104b9b;
switchD_00104c0d_caseD_25:
LAB_00104c3a:
  bVar5 = *local_68;
  local_68 = local_68 + 1;
  if (bVar18 != bVar5) {
    return (char *)0x0;
  }
  goto LAB_001053a0;
}

Assistant:

char * arg_strptime(const char * buf, const char * fmt, struct tm * tm) {
	char c;
	const char * bp;
	size_t len = 0;
	int alt_format, i, split_year = 0;

	bp = buf;

	while ((c = *fmt) != '\0') {
		/* Clear `alternate' modifier prior to new conversion. */
		alt_format = 0;

		/* Eat up white-space. */
		if (isspace(c)) {
			while (isspace(*bp)) {
				bp++;
			}

			fmt++;
			continue;
		}

		if ((c = *fmt++) != '%') {
			goto literal;
		}


again:

		switch (c = *fmt++) {
			case '%': /* "%%" is converted to "%". */
literal:
				if (c != *bp++) {
					return (0);
				}

				break;

			/*
			 * "Alternative" modifiers. Just set the appropriate flag
			 * and start over again.
			 */
			case 'E': /* "%E?" alternative conversion modifier. */
				LEGAL_ALT(0);
				alt_format |= ALT_E;
				goto again;

			case 'O': /* "%O?" alternative conversion modifier. */
				LEGAL_ALT(0);
				alt_format |= ALT_O;
				goto again;

			/*
			 * "Complex" conversion rules, implemented through recursion.
			 */
			case 'c': /* Date and time, using the locale's format. */
				LEGAL_ALT(ALT_E);
				bp = arg_strptime(bp, "%x %X", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'D': /* The date as "%m/%d/%y". */
				LEGAL_ALT(0);
				bp = arg_strptime(bp, "%m/%d/%y", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'R': /* The time as "%H:%M". */
				LEGAL_ALT(0);
				bp = arg_strptime(bp, "%H:%M", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'r': /* The time in 12-hour clock representation. */
				LEGAL_ALT(0);
				bp = arg_strptime(bp, "%I:%M:%S %p", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'T': /* The time as "%H:%M:%S". */
				LEGAL_ALT(0);
				bp = arg_strptime(bp, "%H:%M:%S", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'X': /* The time, using the locale's format. */
				LEGAL_ALT(ALT_E);
				bp = arg_strptime(bp, "%H:%M:%S", tm);

				if (!bp) {
					return (0);
				}

				break;

			case 'x': /* The date, using the locale's format. */
				LEGAL_ALT(ALT_E);
				bp = arg_strptime(bp, "%m/%d/%y", tm);

				if (!bp) {
					return (0);
				}

				break;

			/*
			 * "Elementary" conversion rules.
			 */
			case 'A': /* The day of week, using the locale's form. */
			case 'a':
				LEGAL_ALT(0);

				for (i = 0; i < 7; i++) {
					/* Full name. */
					len = strlen(day[i]);

					if (arg_strncasecmp(day[i], bp, len) == 0) {
						break;
					}

					/* Abbreviated name. */
					len = strlen(abday[i]);

					if (arg_strncasecmp(abday[i], bp, len) == 0) {
						break;
					}
				}

				/* Nothing matched. */
				if (i == 7) {
					return (0);
				}

				tm->tm_wday = i;
				bp += len;
				break;

			case 'B': /* The month, using the locale's form. */
			case 'b':
			case 'h':
				LEGAL_ALT(0);

				for (i = 0; i < 12; i++) {
					/* Full name. */
					len = strlen(mon[i]);

					if (arg_strncasecmp(mon[i], bp, len) == 0) {
						break;
					}

					/* Abbreviated name. */
					len = strlen(abmon[i]);

					if (arg_strncasecmp(abmon[i], bp, len) == 0) {
						break;
					}
				}

				/* Nothing matched. */
				if (i == 12) {
					return (0);
				}

				tm->tm_mon = i;
				bp += len;
				break;

			case 'C': /* The century number. */
				LEGAL_ALT(ALT_E);

				if (!(conv_num(&bp, &i, 0, 99))) {
					return (0);
				}

				if (split_year) {
					tm->tm_year = (tm->tm_year % 100) + (i * 100);
				} else {
					tm->tm_year = i * 100;
					split_year = 1;
				}

				break;

			case 'd': /* The day of month. */
			case 'e':
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_mday, 1, 31))) {
					return (0);
				}

				break;

			case 'k': /* The hour (24-hour clock representation). */
				LEGAL_ALT(0);

			/* FALLTHROUGH */
			case 'H':
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_hour, 0, 23))) {
					return (0);
				}

				break;

			case 'l': /* The hour (12-hour clock representation). */
				LEGAL_ALT(0);

			/* FALLTHROUGH */
			case 'I':
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_hour, 1, 12))) {
					return (0);
				}

				if (tm->tm_hour == 12) {
					tm->tm_hour = 0;
				}

				break;

			case 'j': /* The day of year. */
				LEGAL_ALT(0);

				if (!(conv_num(&bp, &i, 1, 366))) {
					return (0);
				}

				tm->tm_yday = i - 1;
				break;

			case 'M': /* The minute. */
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_min, 0, 59))) {
					return (0);
				}

				break;

			case 'm': /* The month. */
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &i, 1, 12))) {
					return (0);
				}

				tm->tm_mon = i - 1;
				break;

			case 'p': /* The locale's equivalent of AM/PM. */
				LEGAL_ALT(0);

				/* AM? */
				if (arg_strcasecmp(am_pm[0], bp) == 0) {
					if (tm->tm_hour > 11) {
						return (0);
					}

					bp += strlen(am_pm[0]);
					break;
				}
				/* PM? */
				else if (arg_strcasecmp(am_pm[1], bp) == 0) {
					if (tm->tm_hour > 11) {
						return (0);
					}

					tm->tm_hour += 12;
					bp += strlen(am_pm[1]);
					break;
				}

				/* Nothing matched. */
				return (0);

			case 'S': /* The seconds. */
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_sec, 0, 61))) {
					return (0);
				}

				break;

			case 'U': /* The week of year, beginning on sunday. */
			case 'W': /* The week of year, beginning on monday. */
				LEGAL_ALT(ALT_O);

				/*
				 * XXX This is bogus, as we can not assume any valid
				 * information present in the tm structure at this
				 * point to calculate a real value, so just check the
				 * range for now.
				 */
				if (!(conv_num(&bp, &i, 0, 53))) {
					return (0);
				}

				break;

			case 'w': /* The day of week, beginning on sunday. */
				LEGAL_ALT(ALT_O);

				if (!(conv_num(&bp, &tm->tm_wday, 0, 6))) {
					return (0);
				}

				break;

			case 'Y': /* The year. */
				LEGAL_ALT(ALT_E);

				if (!(conv_num(&bp, &i, 0, 9999))) {
					return (0);
				}

				tm->tm_year = i - TM_YEAR_BASE;
				break;

			case 'y': /* The year within 100 years of the epoch. */
				LEGAL_ALT(ALT_E | ALT_O);

				if (!(conv_num(&bp, &i, 0, 99))) {
					return (0);
				}

				if (split_year) {
					tm->tm_year = ((tm->tm_year / 100) * 100) + i;
					break;
				}

				split_year = 1;

				if (i <= 68) {
					tm->tm_year = i + 2000 - TM_YEAR_BASE;
				} else {
					tm->tm_year = i + 1900 - TM_YEAR_BASE;
				}

				break;

			/*
			 * Miscellaneous conversions.
			 */
			case 'n': /* Any kind of white-space. */
			case 't':
				LEGAL_ALT(0);

				while (isspace(*bp)) {
					bp++;
				}

				break;


			default: /* Unknown/unsupported conversion. */
				return (0);
		}


	}

	/* LINTED functional specification */
	return ((char *)bp);
}